

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O2

void TestStringToDoubleSeparator(void)

{
  ulong in_RAX;
  bool *pbVar1;
  bool *pbVar2;
  char *pcVar3;
  int flags;
  char cVar4;
  char *pcVar5;
  uc16 separator;
  int in_R9D;
  double dVar6;
  bool all_used;
  ulong uStack_38;
  int processed;
  
  pbVar2 = &all_used;
  pbVar1 = pbVar2;
  uStack_38 = in_RAX;
  dVar6 = StrToD("000\'001.0\'0",0,0.0,&processed,pbVar2,0x27);
  CheckEqualsHelper((char *)0xd59,0xc15dce,
                    "StrToD(\"000\'001.0\'0\", flags, 0.0, &processed, &all_used, separator)",1.0,
                    pbVar1,dVar6);
  CheckHelper((char *)0xd5a,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar6 = StrToD("0\'0\'0\'0\'0\'1.0\'0",0,0.0,&processed,pbVar2,0x27);
  CheckEqualsHelper((char *)0xd5d,0xc15dce,
                    "StrToD(\"0\'0\'0\'0\'0\'1.0\'0\", flags, 0.0, &processed, &all_used, separator)"
                    ,1.0,pbVar1,dVar6);
  CheckHelper((char *)0xd5e,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar6 = StrToD("\'1.0",0,0.0,&processed,pbVar2,0x27);
  CheckEqualsHelper((char *)0xd61,0xc131d8,
                    "StrToD(\"\'1.0\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xd62,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("1\'.0",0,0.0,&processed,pbVar2,0x27);
  CheckEqualsHelper((char *)0xd65,0xc131d8,
                    "StrToD(\"1\'.0\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xd66,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("1.\'0",0,0.0,&processed,pbVar2,0x27);
  CheckEqualsHelper((char *)0xd69,0xc131d8,
                    "StrToD(\"1.\'0\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xd6a,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("0\'\'1.0",0,0.0,&processed,pbVar2,0x27);
  CheckEqualsHelper((char *)0xd6d,0xc131d8,
                    "StrToD(\"0\'\'1.0\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xd6e,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("1.0e1\'0",0,0.0,&processed,pbVar2,0x27);
  CheckEqualsHelper((char *)0xd71,0xc131d8,
                    "StrToD(\"1.0e1\'0\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xd72,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("1.0e1\'",0,0.0,&processed,pbVar2,0x27);
  CheckEqualsHelper((char *)0xd75,0xc131d8,
                    "StrToD(\"1.0e1\'\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xd76,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("1.0e\'1",0,0.0,&processed,pbVar2,0x27);
  CheckEqualsHelper((char *)0xd79,0xc131d8,
                    "StrToD(\"1.0e\'1\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xd7a,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("1.0\'e1",0,0.0,&processed,pbVar2,0x27);
  CheckEqualsHelper((char *)0xd7d,0xc131d8,
                    "StrToD(\"1.0\'e1\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xd7e,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("+\'1.0e1",0,0.0,&processed,pbVar2,0x27);
  CheckEqualsHelper((char *)0xd81,0xc131d8,
                    "StrToD(\"+\'1.0e1\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xd82,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("-\'1.0e1",0,0.0,&processed,pbVar2,0x27);
  CheckEqualsHelper((char *)0xd85,0xc131d8,
                    "StrToD(\"-\'1.0e1\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xd86,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("1.0e+\'1",0,0.0,&processed,pbVar2,0x27);
  CheckEqualsHelper((char *)0xd89,0xc131d8,
                    "StrToD(\"1.0e+\'1\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xd8a,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("1.0e-\'1",0,0.0,&processed,pbVar2,0x27);
  CheckEqualsHelper((char *)0xd8d,0xc131d8,
                    "StrToD(\"1.0e-\'1\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xd8e,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("1.0e\'+1",0,0.0,&processed,pbVar2,0x27);
  CheckEqualsHelper((char *)0xd91,0xc131d8,
                    "StrToD(\"1.0e\'+1\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xd92,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("1.0e\'-1",0,0.0,&processed,pbVar2,0x27);
  CheckEqualsHelper((char *)0xd95,0xc131d8,
                    "StrToD(\"1.0e\'-1\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xd96,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("000 001.0 0",0,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xd9c,0xc15dce,
                    "StrToD(\"000 001.0 0\", flags, 0.0, &processed, &all_used, separator)",1.0,
                    pbVar1,dVar6);
  CheckHelper((char *)0xd9d,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar6 = StrToD("0 0 0 0 0 1.0 0",0,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xda0,0xc15dce,
                    "StrToD(\"0 0 0 0 0 1.0 0\", flags, 0.0, &processed, &all_used, separator)",1.0,
                    pbVar1,dVar6);
  CheckHelper((char *)0xda1,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar6 = StrToD(" 1.0",0,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xda4,0xc131d8,
                    "StrToD(\" 1.0\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xda5,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("1 .0",0,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xda8,0xc131d8,
                    "StrToD(\"1 .0\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xda9,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("1. 0",0,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xdac,0xc131d8,
                    "StrToD(\"1. 0\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xdad,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("0  1.0",0,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xdb0,0xc131d8,
                    "StrToD(\"0  1.0\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xdb1,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("1.0e1 0",0,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xdb4,0xc131d8,
                    "StrToD(\"1.0e1 0\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xdb5,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("1.0e1 ",0,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xdb8,0xc131d8,
                    "StrToD(\"1.0e1 \", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xdb9,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("1.0e 1",0,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xdbc,0xc131d8,
                    "StrToD(\"1.0e 1\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xdbd,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("1.0 e1",0,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xdc0,0xc131d8,
                    "StrToD(\"1.0 e1\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xdc1,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("+ 1.0e1",0,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xdc4,0xc131d8,
                    "StrToD(\"+ 1.0e1\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xdc5,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("- 1.0e1",0,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xdc8,0xc131d8,
                    "StrToD(\"- 1.0e1\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xdc9,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("1.0e+ 1",0,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xdcc,0xc131d8,
                    "StrToD(\"1.0e+ 1\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xdcd,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("1.0e- 1",0,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xdd0,0xc131d8,
                    "StrToD(\"1.0e- 1\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xdd1,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("1.0e +1",0,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xdd4,0xc131d8,
                    "StrToD(\"1.0e +1\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xdd5,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("1.0e -1",0,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xdd8,0xc131d8,
                    "StrToD(\"1.0e -1\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xdd9,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("000 001.0 0",0x18,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xde0,0xc15dce,
                    "StrToD(\"000 001.0 0\", flags, 0.0, &processed, &all_used, separator)",1.0,
                    pbVar1,dVar6);
  CheckHelper((char *)0xde1,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar6 = StrToD("0 0 0 0 0 1.0 0",0x18,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xde4,0xc15dce,
                    "StrToD(\"0 0 0 0 0 1.0 0\", flags, 0.0, &processed, &all_used, separator)",1.0,
                    pbVar1,dVar6);
  CheckHelper((char *)0xde5,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar6 = StrToD("  000 001.0 0   ",0x18,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xde8,0xc15dce,
                    "StrToD(\"  000 001.0 0   \", flags, 0.0, &processed, &all_used, separator)",1.0
                    ,pbVar1,dVar6);
  CheckHelper((char *)0xde9,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar6 = StrToD("   0 0 0 0 0 1.0 0   ",0x18,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xdec,0xc15dce,
                    "StrToD(\"   0 0 0 0 0 1.0 0   \", flags, 0.0, &processed, &all_used, separator)"
                    ,1.0,pbVar1,dVar6);
  CheckHelper((char *)0xded,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = pbVar2;
  dVar6 = StrToD(" 1.0",0x18,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xdf0,0xc15dce,
                    "StrToD(\" 1.0\", flags, 0.0, &processed, &all_used, separator)",1.0,pbVar1,
                    dVar6);
  CheckHelper((char *)0xdf1,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  dVar6 = StrToD("1 .0",0x18,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xdf4,0xc131d8,
                    "StrToD(\"1 .0\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar2,
                    dVar6);
  CheckEqualsHelper((char *)0xdf5,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  dVar6 = StrToD("1. 0",0x18,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xdf8,0xc131d8,
                    "StrToD(\"1. 0\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar2,
                    dVar6);
  CheckEqualsHelper((char *)0xdf9,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  dVar6 = StrToD("0  1.0",0x18,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xdfc,0xc131d8,
                    "StrToD(\"0  1.0\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar2,
                    dVar6);
  CheckEqualsHelper((char *)0xdfd,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  pbVar1 = pbVar2;
  dVar6 = StrToD("1.0e1 0",0x18,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xe00,0xc131d8,
                    "StrToD(\"1.0e1 0\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar1,
                    dVar6);
  CheckEqualsHelper((char *)0xe01,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = pbVar2;
  dVar6 = StrToD("1.0e1 ",0x18,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xe04,0xc14bc6,
                    "StrToD(\"1.0e1 \", flags, 0.0, &processed, &all_used, separator)",10.0,pbVar1,
                    dVar6);
  CheckHelper((char *)0xe05,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  dVar6 = StrToD("1.0e 1",0x18,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xe08,0xc131d8,
                    "StrToD(\"1.0e 1\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar2,
                    dVar6);
  CheckEqualsHelper((char *)0xe09,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  dVar6 = StrToD("1.0 e1",0x18,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xe0c,0xc131d8,
                    "StrToD(\"1.0 e1\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar2,
                    dVar6);
  CheckEqualsHelper((char *)0xe0d,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  dVar6 = StrToD("+ 1.0e1",0x18,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xe10,0xc131d8,
                    "StrToD(\"+ 1.0e1\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar2,
                    dVar6);
  CheckEqualsHelper((char *)0xe11,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  dVar6 = StrToD("- 1.0e1",0x18,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xe14,0xc131d8,
                    "StrToD(\"- 1.0e1\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar2,
                    dVar6);
  CheckEqualsHelper((char *)0xe15,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  dVar6 = StrToD("1.0e+ 1",0x18,0.0,&processed,pbVar2,0x20);
  CheckEqualsHelper((char *)0xe18,0xc131d8,
                    "StrToD(\"1.0e+ 1\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar2,
                    dVar6);
  CheckEqualsHelper((char *)0xe19,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  dVar6 = StrToD("1.0e- 1",0x18,0.0,&processed,&all_used,0x20);
  CheckEqualsHelper((char *)0xe1c,0xc131d8,
                    "StrToD(\"1.0e- 1\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar2,
                    dVar6);
  CheckEqualsHelper((char *)0xe1d,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  dVar6 = StrToD("1.0e +1",0x18,0.0,&processed,&all_used,0x20);
  CheckEqualsHelper((char *)0xe20,0xc131d8,
                    "StrToD(\"1.0e +1\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar2,
                    dVar6);
  CheckEqualsHelper((char *)0xe21,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  dVar6 = StrToD("1.0e -1",0x18,0.0,&processed,&all_used,0x20);
  CheckEqualsHelper((char *)0xe24,0xc131d8,
                    "StrToD(\"1.0e -1\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar2,
                    dVar6);
  CheckEqualsHelper((char *)0xe25,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  dVar6 = StrToD("0x1 2",0x99,0.0,&processed,&all_used,0x20);
  CheckEqualsHelper((char *)0xe2d,0xc13671,
                    "StrToD(\"0x1 2\", flags, 0.0, &processed, &all_used, separator)",18.0,pbVar2,
                    dVar6);
  CheckHelper((char *)0xe2e,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar2,0));
  pbVar2 = &all_used;
  dVar6 = StrToD("0x0 0",0x99,1.0,&processed,&all_used,0x20);
  CheckEqualsHelper((char *)0xe30,0xc0f3ff,
                    "StrToD(\"0x0 0\", flags, 1.0, &processed, &all_used, separator)",0.0,pbVar2,
                    dVar6);
  CheckHelper((char *)0xe31,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar2,0));
  pbVar2 = &all_used;
  dVar6 = StrToD("0x1 2 3 4 5 6 7 8 9",0x99,NAN,&processed,&all_used,0x20);
  CheckEqualsHelper((char *)0xe35,0xc136e2,
                    "StrToD(\"0x1 2 3 4 5 6 7 8 9\", flags, Double::NaN(), &processed, &all_used, separator)"
                    ,4886718345.0,pbVar2,dVar6);
  CheckHelper((char *)0xe36,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar2,0));
  pbVar2 = &all_used;
  dVar6 = StrToD(" 0x1 2 ",0x99,0.0,&processed,&all_used,0x20);
  CheckEqualsHelper((char *)0xe39,0xc13671,
                    "StrToD(\" 0x1 2 \", flags, 0.0, &processed, &all_used, separator)",18.0,pbVar2,
                    dVar6);
  CheckHelper((char *)0xe3a,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar2,0));
  pbVar2 = &all_used;
  dVar6 = StrToD(" 0x0 ",0x99,1.0,&processed,&all_used,0x20);
  CheckEqualsHelper((char *)0xe3d,0xc0f3ff,
                    "StrToD(\" 0x0 \", flags, 1.0, &processed, &all_used, separator)",0.0,pbVar2,
                    dVar6);
  CheckHelper((char *)0xe3e,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar2,0));
  pbVar2 = &all_used;
  dVar6 = StrToD(" 0x1 2 3 4 5 6 7 8 9 ",0x99,NAN,&processed,&all_used,0x20);
  CheckEqualsHelper((char *)0xe42,0xc136e2,
                    "StrToD(\" 0x1 2 3 4 5 6 7 8 9 \", flags, Double::NaN(), &processed, &all_used, separator)"
                    ,4886718345.0,pbVar2,dVar6);
  CheckHelper((char *)0xe43,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar2,0));
  pbVar2 = &all_used;
  dVar6 = StrToD("0xa b c d e f",0x99,0.0,&processed,&all_used,0x20);
  CheckEqualsHelper((char *)0xe47,0xc13819,
                    "StrToD(\"0xa b c d e f\", flags, 0.0, &processed, &all_used, separator)",
                    11259375.0,pbVar2,dVar6);
  CheckHelper((char *)0xe48,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar2,0));
  pbVar2 = &all_used;
  dVar6 = StrToD("0x 1 2",0x99,0.0,&processed,&all_used,0x20);
  CheckEqualsHelper((char *)0xe4b,0xc131d8,
                    "StrToD(\"0x 1 2\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar2,
                    dVar6);
  CheckEqualsHelper((char *)0xe4c,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  dVar6 = StrToD("0 x0",0x99,1.0,&processed,&all_used,0x20);
  CheckEqualsHelper((char *)0xe4f,0xc131d8,
                    "StrToD(\"0 x0\", flags, 1.0, &processed, &all_used, separator)",NAN,pbVar2,
                    dVar6);
  CheckEqualsHelper((char *)0xe50,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  dVar6 = StrToD("0x1 2  3 4 5 6 7 8 9",0x99,NAN,&processed,&all_used,0x20);
  CheckEqualsHelper((char *)0xe54,0xc131d8,
                    "StrToD(\"0x1 2  3 4 5 6 7 8 9\", flags, Double::NaN(), &processed, &all_used, separator)"
                    ,NAN,pbVar2,dVar6);
  CheckEqualsHelper((char *)0xe55,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  dVar6 = StrToD(" 0 x1 2 ",0x99,0.0,&processed,&all_used,0x20);
  CheckEqualsHelper((char *)0xe58,0xc131d8,
                    "StrToD(\" 0 x1 2 \", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar2,
                    dVar6);
  CheckEqualsHelper((char *)0xe59,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  dVar6 = StrToD("0x0 3p0",0x99,0.0,&processed,&all_used,0x20);
  CheckEqualsHelper((char *)0xe5c,0xc0f7e5,
                    "StrToD(\"0x0 3p0\", flags, 0.0, &processed, &all_used, separator)",3.0,pbVar2,
                    dVar6);
  CheckHelper((char *)0xe5d,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar2,0));
  pbVar2 = &all_used;
  dVar6 = StrToD("0x.0 0p0",0x99,0.0,&processed,&all_used,0x20);
  CheckEqualsHelper((char *)0xe60,0xc0f3ff,
                    "StrToD(\"0x.0 0p0\", flags, 0.0, &processed, &all_used, separator)",0.0,pbVar2,
                    dVar6);
  CheckHelper((char *)0xe61,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar2,0));
  pbVar2 = &all_used;
  dVar6 = StrToD("0x3.0 0p0",0x99,0.0,&processed,&all_used,0x20);
  CheckEqualsHelper((char *)0xe64,0xc0f7e5,
                    "StrToD(\"0x3.0 0p0\", flags, 0.0, &processed, &all_used, separator)",3.0,pbVar2
                    ,dVar6);
  CheckHelper((char *)0xe65,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar2,0));
  pbVar2 = &all_used;
  dVar6 = StrToD("0x0 3.p0",0x99,0.0,&processed,&all_used,0x20);
  CheckEqualsHelper((char *)0xe68,0xc0f7e5,
                    "StrToD(\"0x0 3.p0\", flags, 0.0, &processed, &all_used, separator)",3.0,pbVar2,
                    dVar6);
  CheckHelper((char *)0xe69,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar2,0));
  pbVar2 = &all_used;
  dVar6 = StrToD("0x 3p0",0x99,0.0,&processed,&all_used,0);
  CheckEqualsHelper((char *)0xe6c,0xc131d8,"StrToD(\"0x 3p0\", flags, 0.0, &processed, &all_used)",
                    NAN,pbVar2,dVar6);
  CheckEqualsHelper((char *)0xe6d,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  dVar6 = StrToD("0x.0 p0",0x99,0.0,&processed,&all_used,0);
  CheckEqualsHelper((char *)0xe70,0xc131d8,"StrToD(\"0x.0 p0\", flags, 0.0, &processed, &all_used)",
                    NAN,pbVar2,dVar6);
  CheckEqualsHelper((char *)0xe71,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  dVar6 = StrToD("0x3.0p0 0",0x99,0.0,&processed,&all_used,0);
  CheckEqualsHelper((char *)0xe74,0xc131d8,
                    "StrToD(\"0x3.0p0 0\", flags, 0.0, &processed, &all_used)",NAN,pbVar2,dVar6);
  CheckEqualsHelper((char *)0xe75,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  dVar6 = StrToD("0x0 3.p 0",0x99,0.0,&processed,&all_used,0);
  CheckEqualsHelper((char *)0xe78,0xc131d8,
                    "StrToD(\"0x0 3.p 0\", flags, 0.0, &processed, &all_used)",NAN,pbVar2,dVar6);
  CheckEqualsHelper((char *)0xe79,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  dVar6 = StrToD("0x3p+ 0",0x99,0.0,&processed,&all_used,0);
  CheckEqualsHelper((char *)0xe7c,0xc131d8,"StrToD(\"0x3p+ 0\", flags, 0.0, &processed, &all_used)",
                    NAN,pbVar2,dVar6);
  CheckEqualsHelper((char *)0xe7d,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  dVar6 = StrToD("0x.0p- 0",0x99,0.0,&processed,&all_used,0);
  CheckEqualsHelper((char *)0xe80,0xc131d8,"StrToD(\"0x.0p- 0\", flags, 0.0, &processed, &all_used)"
                    ,NAN,pbVar2,dVar6);
  CheckEqualsHelper((char *)0xe81,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  dVar6 = StrToD("0x3.0p +0",0x99,0.0,&processed,&all_used,0);
  CheckEqualsHelper((char *)0xe84,0xc131d8,
                    "StrToD(\"0x3.0p +0\", flags, 0.0, &processed, &all_used)",NAN,pbVar2,dVar6);
  CheckEqualsHelper((char *)0xe85,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar2 = &all_used;
  dVar6 = StrToD("0x0 3.p -0",0x99,0.0,&processed,&all_used,0);
  CheckEqualsHelper((char *)0xe88,0xc131d8,
                    "StrToD(\"0x0 3.p -0\", flags, 0.0, &processed, &all_used)",NAN,pbVar2,dVar6);
  pcVar5 = (char *)(uStack_38 >> 0x20);
  pcVar3 = "processed";
  CheckEqualsHelper((char *)0xe89,0xc1672f,(char *)0x0,0xc13215,pcVar5,in_R9D);
  flags = (int)&processed;
  cVar4 = (char)pcVar5;
  dVar6 = StrToD16("0x1@2",flags,0.0,(int *)&all_used,(bool *)pcVar3,cVar4,(uc16)in_R9D);
  CheckEqualsHelper((char *)0xe94,0xc13671,
                    "StrToD16(\"0x1@2\", flags, 0.0, &processed, &all_used, char_separator, separator)"
                    ,18.0,pcVar3,dVar6);
  CheckHelper((char *)0xe95,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pcVar3,0));
  dVar6 = StrToD16("0x0@0",flags,1.0,(int *)&all_used,(bool *)pcVar3,cVar4,(uc16)in_R9D);
  CheckEqualsHelper((char *)0xe98,0xc0f3ff,
                    "StrToD16(\"0x0@0\", flags, 1.0, &processed, &all_used, char_separator, separator)"
                    ,0.0,pcVar3,dVar6);
  CheckHelper((char *)0xe99,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pcVar3,0));
  dVar6 = StrToD16("0x1@2@3@4@5@6@7@8@9",flags,NAN,(int *)&all_used,(bool *)pcVar3,cVar4,
                   (uc16)in_R9D);
  CheckEqualsHelper((char *)0xe9d,0xc136e2,
                    "StrToD16(\"0x1@2@3@4@5@6@7@8@9\", flags, Double::NaN(), &processed, &all_used, char_separator, separator)"
                    ,4886718345.0,pcVar3,dVar6);
  CheckHelper((char *)0xe9e,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pcVar3,0));
  dVar6 = StrToD16(" 0x1@2 ",flags,0.0,(int *)&all_used,(bool *)pcVar3,cVar4,(uc16)in_R9D);
  CheckEqualsHelper((char *)0xea1,0xc13671,
                    "StrToD16(\" 0x1@2 \", flags, 0.0, &processed, &all_used, char_separator, separator)"
                    ,18.0,pcVar3,dVar6);
  CheckHelper((char *)0xea2,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pcVar3,0));
  dVar6 = StrToD16("0xa@b@c@d@e@f",flags,0.0,(int *)&all_used,(bool *)pcVar3,cVar4,(uc16)in_R9D);
  CheckEqualsHelper((char *)0xea6,0xc13819,
                    "StrToD16(\"0xa@b@c@d@e@f\", flags, 0.0, &processed, &all_used, char_separator, separator)"
                    ,11259375.0,pcVar3,dVar6);
  CheckHelper((char *)0xea7,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pcVar3,0));
  dVar6 = StrToD16("0x@1@2",flags,0.0,(int *)&all_used,(bool *)pcVar3,cVar4,(uc16)in_R9D);
  CheckEqualsHelper((char *)0xeab,0xc131d8,
                    "StrToD16(\"0x@1@2\", flags, 0.0, &processed, &all_used, char_separator, separator)"
                    ,NAN,pcVar3,dVar6);
  pcVar5 = (char *)(uStack_38 >> 0x20);
  pcVar3 = "processed";
  CheckEqualsHelper((char *)0xeac,0xc1672f,(char *)0x0,0xc13215,pcVar5,in_R9D);
  dVar6 = StrToD16("0@x0",flags,1.0,(int *)&all_used,(bool *)pcVar3,(char)pcVar5,(uc16)in_R9D);
  CheckEqualsHelper((char *)0xeb0,0xc131d8,
                    "StrToD16(\"0@x0\", flags, 1.0, &processed, &all_used, char_separator, separator)"
                    ,NAN,pcVar3,dVar6);
  pcVar5 = (char *)(uStack_38 >> 0x20);
  pcVar3 = "processed";
  CheckEqualsHelper((char *)0xeb1,0xc1672f,(char *)0x0,0xc13215,pcVar5,in_R9D);
  dVar6 = StrToD16("0x1@2@@3@4@5@6@7@8@9",flags,NAN,(int *)&all_used,(bool *)pcVar3,(char)pcVar5,
                   (uc16)in_R9D);
  CheckEqualsHelper((char *)0xeb5,0xc131d8,
                    "StrToD16(\"0x1@2@@3@4@5@6@7@8@9\", flags, Double::NaN(), &processed, &all_used, char_separator, separator)"
                    ,NAN,pcVar3,dVar6);
  pcVar5 = (char *)(uStack_38 >> 0x20);
  pcVar3 = "processed";
  CheckEqualsHelper((char *)0xeb6,0xc1672f,(char *)0x0,0xc13215,pcVar5,in_R9D);
  cVar4 = (char)pcVar5;
  separator = (uc16)in_R9D;
  dVar6 = StrToD16("0x0@3p0",flags,0.0,(int *)&all_used,(bool *)pcVar3,cVar4,separator);
  CheckEqualsHelper((char *)0xeba,0xc0f7e5,
                    "StrToD16(\"0x0@3p0\", flags, 0.0, &processed, &all_used, char_separator, separator)"
                    ,3.0,pcVar3,dVar6);
  CheckHelper((char *)0xebb,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pcVar3,0));
  dVar6 = StrToD16("0x.0@0p0",flags,0.0,(int *)&all_used,(bool *)pcVar3,cVar4,separator);
  CheckEqualsHelper((char *)0xebf,0xc0f3ff,
                    "StrToD16(\"0x.0@0p0\", flags, 0.0, &processed, &all_used, char_separator, separator)"
                    ,0.0,pcVar3,dVar6);
  CheckHelper((char *)0xec0,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pcVar3,0));
  dVar6 = StrToD16("0x3.0@0p0",flags,0.0,(int *)&all_used,(bool *)pcVar3,cVar4,separator);
  CheckEqualsHelper((char *)0xec4,0xc0f7e5,
                    "StrToD16(\"0x3.0@0p0\", flags, 0.0, &processed, &all_used, char_separator, separator)"
                    ,3.0,pcVar3,dVar6);
  CheckHelper((char *)0xec5,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pcVar3,0));
  dVar6 = StrToD16("0x0@3.p0",flags,0.0,(int *)&all_used,(bool *)pcVar3,cVar4,separator);
  CheckEqualsHelper((char *)0xec9,0xc0f7e5,
                    "StrToD16(\"0x0@3.p0\", flags, 0.0, &processed, &all_used, char_separator, separator)"
                    ,3.0,pcVar3,dVar6);
  CheckHelper((char *)0xeca,0xc13095,(char *)(ulong)all_used,SUB81(pcVar3,0));
  return;
}

Assistant:

TEST(StringToDoubleSeparator) {
  int flags;
  int processed;
  bool all_used;
  uc16 separator;

  separator = '\'';
  flags = StringToDoubleConverter::NO_FLAGS;

  CHECK_EQ(1.0, StrToD("000'001.0'0", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("0'0'0'0'0'1.0'0", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD("'1.0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1'.0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.'0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("0''1.0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e1'0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e1'", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e'1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0'e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("+'1.0e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("-'1.0e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e+'1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e-'1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e'+1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e'-1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  separator = ' ';
  flags = StringToDoubleConverter::NO_FLAGS;

  CHECK_EQ(1.0, StrToD("000 001.0 0", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("0 0 0 0 0 1.0 0", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD(" 1.0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1 .0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1. 0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("0  1.0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e1 0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e1 ", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e 1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0 e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("+ 1.0e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("- 1.0e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e+ 1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e- 1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e +1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e -1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  separator = ' ';
  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES;

  CHECK_EQ(1.0, StrToD("000 001.0 0", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("0 0 0 0 0 1.0 0", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("  000 001.0 0   ", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD("   0 0 0 0 0 1.0 0   ", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD(" 1.0", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD("1 .0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1. 0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("0  1.0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e1 0", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(10.0, StrToD("1.0e1 ", flags, 0.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD("1.0e 1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0 e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("+ 1.0e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("- 1.0e1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e+ 1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e- 1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e +1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("1.0e -1", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  separator = ' ';
  flags = StringToDoubleConverter::ALLOW_HEX |
      StringToDoubleConverter::ALLOW_HEX_FLOATS |
      StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES;

  CHECK_EQ(18.0, StrToD("0x1 2", flags, 0.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("0x0 0", flags, 1.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(static_cast<double>(0x123456789),
           StrToD("0x1 2 3 4 5 6 7 8 9", flags, Double::NaN(),
                  &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(18.0, StrToD(" 0x1 2 ", flags, 0.0,
                        &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD(" 0x0 ", flags, 1.0,
                       &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(static_cast<double>(0x123456789),
           StrToD(" 0x1 2 3 4 5 6 7 8 9 ", flags, Double::NaN(),
                  &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(static_cast<double>(0xabcdef),
           StrToD("0xa b c d e f", flags, 0.0,
                  &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD("0x 1 2", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("0 x0", flags, 1.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0x1 2  3 4 5 6 7 8 9", flags, Double::NaN(),
                  &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD(" 0 x1 2 ", flags, 0.0,
                                 &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(3.0,
           StrToD("0x0 3p0", flags, 0.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(0.0,
           StrToD("0x.0 0p0", flags, 0.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(3.0,
           StrToD("0x3.0 0p0", flags, 0.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(3.0,
           StrToD("0x0 3.p0", flags, 0.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("0x 3p0", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0x.0 p0", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0x3.0p0 0", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0x0 3.p 0", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0x3p+ 0", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0x.0p- 0", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0x3.0p +0", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD("0x0 3.p -0", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  separator = 0x202F;
  char char_separator = '@';
  flags = StringToDoubleConverter::ALLOW_HEX |
      StringToDoubleConverter::ALLOW_HEX_FLOATS |
      StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES;

  CHECK_EQ(18.0,
           StrToD16("0x1@2", flags, 0.0, &processed, &all_used,
                    char_separator, separator));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD16("0x0@0", flags, 1.0, &processed, &all_used,
                         char_separator, separator));
  CHECK(all_used);

  CHECK_EQ(static_cast<double>(0x123456789),
           StrToD16("0x1@2@3@4@5@6@7@8@9", flags, Double::NaN(),
                    &processed, &all_used, char_separator, separator));
  CHECK(all_used);

  CHECK_EQ(18.0, StrToD16(" 0x1@2 ", flags, 0.0,
                          &processed, &all_used, char_separator, separator));
  CHECK(all_used);

  CHECK_EQ(static_cast<double>(0xabcdef),
           StrToD16("0xa@b@c@d@e@f", flags, 0.0,
                    &processed, &all_used, char_separator, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD16("0x@1@2", flags, 0.0,
                    &processed, &all_used, char_separator, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD16("0@x0", flags, 1.0,
                    &processed, &all_used, char_separator, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(),
           StrToD16("0x1@2@@3@4@5@6@7@8@9", flags, Double::NaN(),
                  &processed, &all_used, char_separator, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(3.0,
           StrToD16("0x0@3p0", flags, 0.0, &processed, &all_used,
                    char_separator, separator));
  CHECK(all_used);

  CHECK_EQ(0.0,
           StrToD16("0x.0@0p0", flags, 0.0, &processed, &all_used,
                    char_separator, separator));
  CHECK(all_used);

  CHECK_EQ(3.0,
           StrToD16("0x3.0@0p0", flags, 0.0, &processed, &all_used,
                    char_separator, separator));
  CHECK(all_used);

  CHECK_EQ(3.0,
           StrToD16("0x0@3.p0", flags, 0.0, &processed, &all_used,
                    char_separator, separator));
  CHECK(all_used);
}